

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O2

void __thiscall
parser::BracketNotationParser<label::JSONLabel>::parse_collection
          (BracketNotationParser<label::JSONLabel> *this,
          vector<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>
          *trees_collection,string *file_path)

{
  bool bVar1;
  istream *piVar2;
  runtime_error *this_00;
  string tree_string;
  Node<label::JSONLabel> local_278;
  ifstream trees_file;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&trees_file,(string *)file_path,_S_in);
  if ((abStack_218[*(long *)(_trees_file + -0x18)] & 5) == 0) {
    tree_string._M_dataplus._M_p = (pointer)&tree_string.field_2;
    tree_string._M_string_length = 0;
    tree_string.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&trees_file,(string *)&tree_string);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      bVar1 = validate_input(this,&tree_string);
      if (bVar1) {
        parse_single(&local_278,this,&tree_string);
        std::vector<node::Node<label::JSONLabel>,std::allocator<node::Node<label::JSONLabel>>>::
        emplace_back<node::Node<label::JSONLabel>>
                  ((vector<node::Node<label::JSONLabel>,std::allocator<node::Node<label::JSONLabel>>>
                    *)trees_collection,&local_278);
        node::Node<label::JSONLabel>::~Node(&local_278);
      }
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&tree_string);
    std::ifstream::~ifstream(&trees_file);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&tree_string,"ERROR: Problem with opening the file \'",file_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278,
                 &tree_string,"\' in BracketNotationParser::parse_collection_efficient.");
  std::runtime_error::runtime_error(this_00,(string *)&local_278);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BracketNotationParser<Label>::parse_collection(
    std::vector<node::Node<Label>>& trees_collection,
    const std::string& file_path) {
  std::ifstream trees_file(file_path);
  if (!trees_file) {
    throw std::runtime_error("ERROR: Problem with opening the file '" + file_path + "' in BracketNotationParser::parse_collection_efficient.");
  }
  // Read the trees line by line, parse, and move into the container.
  std::string tree_string;
  while (std::getline(trees_file, tree_string)) {
    if (!validate_input(tree_string)) {
      continue;
    }
    trees_collection.push_back(parse_single(tree_string)); // -> This invokes a move constructor (due to push_back(<rvalue>)).
  }
  trees_file.close();
}